

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1ccb39::PeerManagerImpl::SendBlockTransactions
          (PeerManagerImpl *this,CNode *pfrom,Peer *peer,CBlock *block,BlockTransactionsRequest *req
          )

{
  ushort uVar1;
  pointer puVar2;
  pointer psVar3;
  CConnman *this_00;
  string msg_type;
  string *message;
  long lVar4;
  string *this_01;
  ulong uVar5;
  long in_FS_OFFSET;
  BlockTransactions resp;
  undefined8 in_stack_ffffffffffffff10;
  undefined1 *in_stack_ffffffffffffff18;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  BlockTransactions local_c8;
  undefined1 *local_90 [2];
  undefined1 local_80 [8];
  undefined8 uStack_78;
  undefined8 local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  BlockTransactions::BlockTransactions(&local_c8,req);
  lVar4 = 0;
  uVar5 = 0;
  do {
    puVar2 = (req->indexes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(req->indexes).
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2 >> 1) <= uVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffff18,"blocktxn",
                 (allocator<char> *)&stack0xffffffffffffff17);
      this_00 = this->m_connman;
      local_90[0] = in_stack_ffffffffffffff18;
      if (in_stack_ffffffffffffff18 == local_d8) {
        uStack_78 = uStack_d0;
        local_90[0] = local_80;
      }
      local_d8[0] = 0;
      msg_type._M_string_length = in_stack_ffffffffffffff10;
      msg_type._M_dataplus._M_p = (pointer)pfrom;
      msg_type.field_2._M_allocated_capacity = (size_type)local_d8;
      msg_type.field_2._8_8_ = 0;
      NetMsg::Make<BlockTransactions&>
                ((CSerializedNetMsg *)&stack0xffffffffffffff90,(NetMsg *)local_90,msg_type,&local_c8
                );
      CConnman::PushMessage(this_00,pfrom,(CSerializedNetMsg *)&stack0xffffffffffffff90);
      CSerializedNetMsg::~CSerializedNetMsg((CSerializedNetMsg *)&stack0xffffffffffffff90);
      std::__cxx11::string::~string((string *)local_90);
      this_01 = (string *)&stack0xffffffffffffff18;
LAB_001b4525:
      std::__cxx11::string::~string(this_01);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector(&local_c8.txn);
      if (*(__pthread_internal_list **)(in_FS_OFFSET + 0x28) != (__pthread_internal_list *)local_38)
      {
        __stack_chk_fail();
      }
      return;
    }
    uVar1 = puVar2[uVar5];
    psVar3 = (block->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(block->vtx).
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4) <=
        (ulong)uVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffff90,"getblocktxn with out-of-bounds tx indices",
                 (allocator<char> *)local_90);
      Misbehaving((PeerManagerImpl *)peer,(Peer *)&stack0xffffffffffffff90,message);
      this_01 = (string *)&stack0xffffffffffffff90;
      goto LAB_001b4525;
    }
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&((local_c8.txn.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
               lVar4),&psVar3[uVar1].
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x10;
  } while( true );
}

Assistant:

void PeerManagerImpl::SendBlockTransactions(CNode& pfrom, Peer& peer, const CBlock& block, const BlockTransactionsRequest& req)
{
    BlockTransactions resp(req);
    for (size_t i = 0; i < req.indexes.size(); i++) {
        if (req.indexes[i] >= block.vtx.size()) {
            Misbehaving(peer, "getblocktxn with out-of-bounds tx indices");
            return;
        }
        resp.txn[i] = block.vtx[req.indexes[i]];
    }

    MakeAndPushMessage(pfrom, NetMsgType::BLOCKTXN, resp);
}